

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_buffer_reset(nk_buffer *buffer,nk_buffer_allocation_type type)

{
  nk_buffer_allocation_type type_local;
  nk_buffer *buffer_local;
  
  if (buffer == (nk_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x1562,"void nk_buffer_reset(struct nk_buffer *, enum nk_buffer_allocation_type)"
                 );
  }
  if (buffer != (nk_buffer *)0x0) {
    if (type == NK_BUFFER_BACK) {
      buffer->needed = buffer->needed - ((buffer->memory).size - buffer->marker[1].offset);
      if (buffer->marker[1].active == 0) {
        buffer->size = (buffer->memory).size;
      }
      else {
        buffer->size = buffer->marker[1].offset;
      }
      buffer->marker[1].active = 0;
    }
    else {
      buffer->needed = buffer->needed - (buffer->allocated - buffer->marker[type].offset);
      if (buffer->marker[type].active == 0) {
        buffer->allocated = 0;
      }
      else {
        buffer->allocated = buffer->marker[type].offset;
      }
      buffer->marker[type].active = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_buffer_reset(struct nk_buffer *buffer, enum nk_buffer_allocation_type type)
{
    NK_ASSERT(buffer);
    if (!buffer) return;
    if (type == NK_BUFFER_BACK) {
        /* reset back buffer either back to marker or empty */
        buffer->needed -= (buffer->memory.size - buffer->marker[type].offset);
        if (buffer->marker[type].active)
            buffer->size = buffer->marker[type].offset;
        else buffer->size = buffer->memory.size;
        buffer->marker[type].active = nk_false;
    } else {
        /* reset front buffer either back to back marker or empty */
        buffer->needed -= (buffer->allocated - buffer->marker[type].offset);
        if (buffer->marker[type].active)
            buffer->allocated = buffer->marker[type].offset;
        else buffer->allocated = 0;
        buffer->marker[type].active = nk_false;
    }
}